

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O0

int singlylinkedlist_remove_if
              (SINGLYLINKEDLIST_HANDLE list,LIST_CONDITION_FUNCTION condition_function,
              void *match_context)

{
  byte bVar1;
  byte local_51;
  LIST_ITEM_INSTANCE *pLStack_50;
  _Bool continue_processing;
  LIST_ITEM_INSTANCE *previous_item;
  LIST_ITEM_INSTANCE *next_item;
  LIST_ITEM_INSTANCE *current_item;
  LIST_INSTANCE *list_instance;
  LOGGER_LOG l;
  void *pvStack_20;
  int result;
  void *match_context_local;
  LIST_CONDITION_FUNCTION condition_function_local;
  SINGLYLINKEDLIST_HANDLE list_local;
  
  pvStack_20 = match_context;
  match_context_local = condition_function;
  condition_function_local = (LIST_CONDITION_FUNCTION)list;
  if ((list == (SINGLYLINKEDLIST_HANDLE)0x0) || (condition_function == (LIST_CONDITION_FUNCTION)0x0)
     ) {
    list_instance = (LIST_INSTANCE *)xlogging_get_log_function();
    if (list_instance != (LIST_INSTANCE *)0x0) {
      (*(code *)list_instance)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/singlylinkedlist.c"
                 ,"singlylinkedlist_remove_if",0x116,1,
                 "Invalid argument (list=%p, condition_function=%p)",condition_function_local,
                 match_context_local);
    }
    l._4_4_ = 0x117;
  }
  else {
    next_item = list->head;
    pLStack_50 = (LIST_ITEM_INSTANCE *)0x0;
    current_item = (LIST_ITEM_INSTANCE *)list;
    while (next_item != (LIST_ITEM_INSTANCE *)0x0) {
      local_51 = 0;
      previous_item = (LIST_ITEM_INSTANCE *)next_item->next;
      bVar1 = (*(code *)match_context_local)(next_item->item,pvStack_20,&local_51);
      if ((bVar1 & 1) == 1) {
        if (pLStack_50 == (LIST_ITEM_INSTANCE *)0x0) {
          current_item->item = previous_item;
        }
        else {
          pLStack_50->next = previous_item;
        }
        if (next_item == (LIST_ITEM_INSTANCE *)current_item->next) {
          current_item->next = pLStack_50;
        }
        free(next_item);
      }
      else {
        pLStack_50 = next_item;
      }
      if ((local_51 & 1) == 0) break;
      next_item = previous_item;
    }
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int singlylinkedlist_remove_if(SINGLYLINKEDLIST_HANDLE list, LIST_CONDITION_FUNCTION condition_function, const void* match_context)
{
    int result;
    /* Codes_SRS_LIST_09_001: [ If the list or the condition_function argument is NULL, singlylinkedlist_remove_if shall return non-zero value. ] */
    if ((list == NULL) ||
        (condition_function == NULL))
    {
        LogError("Invalid argument (list=%p, condition_function=%p)", list, condition_function);
        result = MU_FAILURE;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* current_item = list_instance->head;
        LIST_ITEM_INSTANCE* next_item = NULL;
        LIST_ITEM_INSTANCE* previous_item = NULL;

        /* Codes_SRS_LIST_09_002: [ singlylinkedlist_remove_if shall iterate through all items in a list and remove all that satisfies a certain condition function. ] */
        while (current_item != NULL)
        {
            bool continue_processing = false;

            next_item = (LIST_ITEM_INSTANCE*)current_item->next;

            /* Codes_SRS_LIST_09_003: [ singlylinkedlist_remove_if shall determine whether an item satisfies the condition criteria by invoking the condition function for that item. ] */
            /* Codes_SRS_LIST_09_004: [ If the condition function returns true, singlylinkedlist_find shall consider that item as to be removed. ] */
            if (condition_function(current_item->item, match_context, &continue_processing) == true)
            {
                if (previous_item != NULL)
                {
                    previous_item->next = next_item;
                }
                else
                {
                    list_instance->head = next_item;
                }

                if (current_item == list_instance->tail)
                {
                    list_instance->tail = previous_item;
                }

                free(current_item);
            }
            /* Codes_SRS_LIST_09_005: [ If the condition function returns false, singlylinkedlist_find shall consider that item as not to be removed. ] */
            else
            {
                previous_item = current_item;
            }

            /* Codes_SRS_LIST_09_006: [ If the condition function returns continue_processing as false, singlylinkedlist_remove_if shall stop iterating through the list and return. ] */
            if (continue_processing == false)
            {
                break;
            }

            current_item = next_item;
        }

        /* Codes_SRS_LIST_09_007: [ If no errors occur, singlylinkedlist_remove_if shall return zero. ] */
        result = 0;
    }

    return result;
}